

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O2

bool __thiscall dd::ProcessThreadImpl::Process(ProcessThreadImpl *this)

{
  Lock *__mutex;
  bool bVar1;
  pointer pDVar2;
  _Elt_pointer ppQVar3;
  QueuedTask *pQVar4;
  int iVar5;
  rep rVar6;
  long lVar7;
  _List_node_base *p_Var8;
  rep rVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  
  rVar6 = GetCurrentTick();
  p_Var11 = (_List_node_base *)(rVar6 + 60000);
  __mutex = &this->_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  bVar1 = this->_stop;
  if (bVar1 == false) {
    p_Var10 = (_List_node_base *)&this->_modules;
    while (p_Var10 = (((_List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)&this->_modules) {
      p_Var8 = p_Var10[1]._M_prev;
      if (p_Var8 == (_List_node_base *)0x0) {
        lVar7 = (*(code *)**(undefined8 **)p_Var10[1]._M_next)();
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        p_Var8 = (_List_node_base *)(lVar7 + rVar6);
        p_Var10[1]._M_prev = p_Var8;
      }
      if ((long)p_Var8 <= rVar6 || p_Var8 == (_List_node_base *)0xffffffffffffffff) {
        (**(code **)(*(long *)p_Var10[1]._M_next + 8))();
        rVar9 = GetCurrentTick();
        lVar7 = (*(code *)**(undefined8 **)p_Var10[1]._M_next)();
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        p_Var8 = (_List_node_base *)(lVar7 + rVar9);
        p_Var10[1]._M_prev = p_Var8;
      }
      if ((long)p_Var8 < (long)p_Var11) {
        p_Var11 = p_Var8;
      }
    }
    while (pDVar2 = (this->_delayed_tasks).c.
                    super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pDVar2 != (this->_delayed_tasks).c.
                    super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var10 = (_List_node_base *)pDVar2->run_at_ms;
      if (rVar6 < (long)p_Var10) {
        if ((long)p_Var10 < (long)p_Var11) {
          p_Var11 = p_Var10;
        }
        break;
      }
      std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::push_back
                (&(this->_queue).c,&pDVar2->task);
      std::
      priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
      ::pop(&this->_delayed_tasks);
    }
    while (ppQVar3 = (this->_queue).c.
                     super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur,
          (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur != ppQVar3) {
      pQVar4 = *ppQVar3;
      std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::pop_front(&(this->_queue).c);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar5 = (*pQVar4->_vptr_QueuedTask[2])(pQVar4);
      if ((char)iVar5 != '\0') {
        (*pQVar4->_vptr_QueuedTask[1])(pQVar4);
      }
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar1 == false) {
    rVar6 = GetCurrentTick();
    if ((long)p_Var11 - rVar6 != 0 && rVar6 <= (long)p_Var11) {
      Event::Wait(&this->_wake_up,(int)((long)p_Var11 - rVar6));
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool ProcessThreadImpl::Process() {
		int64_t now = GetCurrentTick();
		int64_t next_checkpoint = now + (1000 * 60);

		{
			AutoLock l(_lock);
			if (_stop)
				return false;
			for (ModuleCallback& m : _modules) {
				if (m.next_callback == 0)
					m.next_callback = GetNextCallbackTime(m.module, now);
				if (m.next_callback <= now || m.next_callback == kCallProcessImmediately) {
					{
						m.module->Process();
					}
					int64_t new_now = GetCurrentTick();
					m.next_callback = GetNextCallbackTime(m.module, new_now);
				}

				if (m.next_callback < next_checkpoint)
					next_checkpoint = m.next_callback;
			}

			while (!_delayed_tasks.empty() && _delayed_tasks.top().run_at_ms <= now) {
				_queue.push(_delayed_tasks.top().task);
				_delayed_tasks.pop();
			}

			if (!_delayed_tasks.empty())
			{
				if (_delayed_tasks.top().run_at_ms < next_checkpoint)
					next_checkpoint = _delayed_tasks.top().run_at_ms;
			}

			while (!_queue.empty()) {
				QueuedTask* task = _queue.front();
				_queue.pop();
				_lock.LockEnd();
				if (task->Run())
					delete task;
				_lock.LockBegin();
			}
		}
		
		int64_t time_to_wait = next_checkpoint - GetCurrentTick();
		if (time_to_wait > 0)
			_wake_up.Wait(static_cast<int>(time_to_wait));
		return true;
	}